

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_queue.h
# Opt level: O0

int __thiscall buffer_queue<int>::get_rcnt(buffer_queue<int> *this)

{
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lck;
  buffer_queue<int> *this_local;
  
  lck._M_device = &this->b_mutex;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->b_mutex);
  if ((this->b_debug & 1U) == 0) {
    if (0 < pr_level) {
      printf("[%-5s][%s:%d] this method is invalid when q_debug is false!\n","warn","get_rcnt",0x41)
      ;
    }
    this_local._4_4_ = -1;
  }
  else {
    this_local._4_4_ = (int)this->b_rcnt;
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return this_local._4_4_;
}

Assistant:

int get_rcnt() const
    {
        lock_guard<mutex> lck (b_mutex);
        if(b_debug)
        {
            return b_rcnt;    
        }
        PR_WARN("this method is invalid when q_debug is false!\n");
        return -1;
    }